

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBLookupTables.cpp
# Opt level: O0

char * GetCDCDescriptorSubtypeName(U8 subtype)

{
  char *local_a8;
  char *Names [17];
  char *pcStack_10;
  U8 subtype_local;
  
  memcpy(&local_a8,&PTR_anon_var_dwarf_28280_0018e630,0x88);
  if (subtype < 0x11) {
    pcStack_10 = Names[(ulong)subtype - 1];
  }
  else {
    pcStack_10 = "<unknown>";
  }
  return pcStack_10;
}

Assistant:

const char* GetCDCDescriptorSubtypeName( U8 subtype )
{
    const char* Names[] = {
        "Header Functional Descriptor",
        "Call Management Functional Descriptor",
        "Abstract Control Management Functional Descriptor",
        "Direct Line Management Functional Descriptor",
        "Telephone Ringer Functional Descriptor",
        "Telephone Call and Line State Reporting Capabilities Functional Descriptor",
        "Union Functional descriptor",
        "Country Selection Functional Descriptor",
        "Telephone Operational Modes Functional Descriptor",
        "USB Terminal Functional Descriptor",
        "Network Channel Terminal Descriptor",
        "Protocol Unit Functional Descriptor",
        "Extension Unit Functional Descriptor",
        "Multi-Channel Management Functional Descriptor",
        "CAPI Control Management Functional Descriptor",
        "Ethernet Networking Functional Descriptor",
        "ATM Networking Functional Descriptor",
    };

    if( subtype < sizeof( Names ) / sizeof( *Names ) )
        return Names[ subtype ];

    return "<unknown>";
}